

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O3

bool __thiscall
binlog::SessionWriter::
addEvent<std::vector<int,std::allocator<int>>,std::__cxx11::list<bool,std::allocator<bool>>>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,
          vector<int,_std::allocator<int>_> *args,list<bool,_std::allocator<bool>_> *args_1)

{
  QueueWriter *this_00;
  long lVar1;
  size_t sVar2;
  int iVar3;
  _List_node_base *p_Var4;
  const_iterator __end0;
  char *pcVar5;
  ulong uVar6;
  
  lVar1 = 3;
  p_Var4 = (_List_node_base *)args_1;
  do {
    p_Var4 = (((_List_base<bool,_std::allocator<bool>_> *)&p_Var4->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    lVar1 = lVar1 + 1;
  } while (p_Var4 != (_List_node_base *)args_1);
  lVar1 = (long)(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish +
          lVar1 + (0x14 - (long)(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start);
  uVar6 = lVar1 + 4;
  this_00 = &this->_qw;
  if (((((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar6) &&
       (sVar2 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar2 < uVar6)) &&
      (replaceChannel(this,uVar6),
      (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar6)) &&
     (sVar2 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar2 < uVar6)) {
    return false;
  }
  *(int *)(this->_qw)._writePos = (int)lVar1;
  pcVar5 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar5 + 4;
  *(uint64_t *)(pcVar5 + 4) = eventSourceId;
  pcVar5 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar5 + 8;
  *(uint64_t *)(pcVar5 + 8) = clock;
  pcVar5 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar5 + 8;
  uVar6 = (long)(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  iVar3 = (int)(uVar6 >> 2);
  *(int *)(pcVar5 + 8) = iVar3;
  pcVar5 = (this->_qw)._writePos + 4;
  (this->_qw)._writePos = pcVar5;
  if (iVar3 != 0) {
    uVar6 = uVar6 & 0x3fffffffc;
    memcpy(pcVar5,(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start,uVar6);
    pcVar5 = (this->_qw)._writePos + uVar6;
    (this->_qw)._writePos = pcVar5;
  }
  *(int *)pcVar5 =
       (int)(args_1->super__List_base<bool,_std::allocator<bool>_>)._M_impl._M_node._M_size;
  pcVar5 = (this->_qw)._writePos + 4;
  (this->_qw)._writePos = pcVar5;
  for (p_Var4 = (args_1->super__List_base<bool,_std::allocator<bool>_>)._M_impl._M_node.
                super__List_node_base._M_next; p_Var4 != (_List_node_base *)args_1;
      p_Var4 = (((_List_base<bool,_std::allocator<bool>_> *)&p_Var4->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next) {
    *pcVar5 = *(char *)&p_Var4[1]._M_next;
    pcVar5 = (this->_qw)._writePos + 1;
    (this->_qw)._writePos = pcVar5;
  }
  (this_00->_queue->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)pcVar5 - (long)this_00->_queue->buffer;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}